

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter> *this,
          int num_args,ArgHandler *arg_handler)

{
  int iVar1;
  LogicalExpr LStack_38;
  
  iVar1 = 0;
  if (0 < num_args) {
    iVar1 = num_args;
  }
  while (iVar1 != 0) {
    ReadLogicalExpr_abi_cxx11_(&LStack_38,this);
    std::__cxx11::string::~string((string *)&LStack_38);
    iVar1 = iVar1 + -1;
  }
  return;
}

Assistant:

void DoReadArgs(int num_args, ArgHandler &arg_handler) {
    ExprReader expr_reader;
    for (int i = 0; i < num_args; ++i)
      arg_handler.AddArg(expr_reader.Read(*this));
  }